

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall
higan::HttpServer::OnNewMessage(HttpServer *this,TcpConnectionPtr *connection,Buffer *buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TcpConnection *pTVar2;
  bool bVar3;
  any *__any;
  HttpContext *this_00;
  HttpRequest *request;
  string local_50;
  
  pTVar2 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HttpContext","");
  __any = TcpConnection::GetContext(pTVar2,&local_50);
  if (__any == (any *)0x0) {
    this_00 = (HttpContext *)0x0;
  }
  else {
    this_00 = (HttpContext *)std::__any_caster<higan::HttpContext>(__any);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar3 = HttpContext::ParseRequest(this_00,buffer);
  if (!bVar3) {
    pTVar2 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"HTTP/1.1 400 Bad Request\r\n\r\n","");
    TcpConnection::Send(pTVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    TcpConnection::DestroyConnection
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
  }
  bVar3 = HttpContext::ParseOver(this_00);
  if (bVar3) {
    request = HttpContext::GetRequest(this_00);
    OnHttpRequest(this,connection,request);
    HttpContext::Reset(this_00);
  }
  return;
}

Assistant:

void HttpServer::OnNewMessage(const TcpConnectionPtr& connection, Buffer* buffer)
{
	HttpContext* context =
			std::any_cast<HttpContext>(connection->GetContext("HttpContext"));

	bool parse_ok = context->ParseRequest(buffer);

	if (!parse_ok)
	{
		/**
		 * 解析失败直接简单粗暴返回错误 .... 可以可以 不分配多余的资源
		 */
		connection->Send("HTTP/1.1 400 Bad Request\r\n\r\n");
		connection->DestroyConnection();
	}

	if (context->ParseOver())
	{
		OnHttpRequest(connection, context->GetRequest());
		context->Reset();
	}
}